

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::MergeFrom
          (CustomModel_CustomModelParamValue *this,CustomModel_CustomModelParamValue *from)

{
  CustomModel_CustomModelParamValue *pCVar1;
  bool bVar2;
  ValueCase VVar3;
  int32_t value;
  LogMessage *other;
  int64_t value_00;
  string *psVar4;
  Arena *pAVar5;
  double value_01;
  LogFinisher local_85;
  uint32_t cached_has_bits;
  byte local_71;
  LogMessage local_70;
  CustomModel_CustomModelParamValue *local_38;
  CustomModel_CustomModelParamValue *from_local;
  CustomModel_CustomModelParamValue *this_local;
  CustomModel_CustomModelParamValue *local_20;
  string *local_18;
  CustomModel_CustomModelParamValue *local_10;
  
  local_71 = 0;
  local_38 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/CustomModel.pb.cc"
               ,0x181);
    local_71 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_70,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_85,other);
  }
  if ((local_71 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_70);
  }
  VVar3 = value_case(local_38);
  switch(VVar3) {
  case VALUE_NOT_SET:
    break;
  case kDoubleValue:
    value_01 = _internal_doublevalue(local_38);
    _internal_set_doublevalue(this,value_01);
    break;
  case kStringValue:
    this_local = (CustomModel_CustomModelParamValue *)_internal_stringvalue_abi_cxx11_(local_38);
    local_20 = this;
    bVar2 = _internal_has_stringvalue(this);
    if (!bVar2) {
      clear_value(this);
      set_has_stringvalue(this);
      psVar4 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
                (&(this->value_).stringvalue_,psVar4);
    }
    pCVar1 = this_local;
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)&this->value_,pCVar1,pAVar5);
    break;
  case kIntValue:
    value = _internal_intvalue(local_38);
    _internal_set_intvalue(this,value);
    break;
  case kLongValue:
    value_00 = _internal_longvalue(local_38);
    _internal_set_longvalue(this,value_00);
    break;
  case kBoolValue:
    bVar2 = _internal_boolvalue(local_38);
    _internal_set_boolvalue(this,bVar2);
    break;
  case kBytesValue:
    local_18 = _internal_bytesvalue_abi_cxx11_(local_38);
    local_10 = this;
    bVar2 = _internal_has_bytesvalue(this);
    if (!bVar2) {
      clear_value(this);
      set_has_bytesvalue(this);
      psVar4 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
                (&(this->value_).stringvalue_,psVar4);
    }
    psVar4 = local_18;
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)&this->value_,psVar4,pAVar5);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_38->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void CustomModel_CustomModelParamValue::MergeFrom(const CustomModel_CustomModelParamValue& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.value_case()) {
    case kDoubleValue: {
      _internal_set_doublevalue(from._internal_doublevalue());
      break;
    }
    case kStringValue: {
      _internal_set_stringvalue(from._internal_stringvalue());
      break;
    }
    case kIntValue: {
      _internal_set_intvalue(from._internal_intvalue());
      break;
    }
    case kLongValue: {
      _internal_set_longvalue(from._internal_longvalue());
      break;
    }
    case kBoolValue: {
      _internal_set_boolvalue(from._internal_boolvalue());
      break;
    }
    case kBytesValue: {
      _internal_set_bytesvalue(from._internal_bytesvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}